

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void slot_error(char *error_string,Am_Object_Data *object_data,Am_Slot_Key key)

{
  ostream *poVar1;
  Am_Object local_28;
  Am_Object object;
  Am_Slot_Key key_local;
  Am_Object_Data *object_data_local;
  char *error_string_local;
  
  object.data._6_2_ = key;
  Am_Wrapper::Note_Reference(&object_data->super_Am_Wrapper);
  Am_Object::Am_Object(&local_28,object_data);
  poVar1 = std::operator<<((ostream *)&std::cerr,"** ");
  poVar1 = std::operator<<(poVar1,error_string);
  poVar1 = std::operator<<(poVar1,"  Object = ");
  poVar1 = operator<<(poVar1,&local_28);
  std::operator<<(poVar1,", Slot = ");
  Am_Print_Key((ostream *)&std::cerr,object.data._6_2_);
  poVar1 = std::operator<<((ostream *)&std::cerr,".");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Am_Error(&local_28,object.data._6_2_);
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

void
slot_error(const char *error_string, Am_Object_Data *object_data,
           Am_Slot_Key key)
{
  object_data->Note_Reference();
  Am_Object object = object_data;
  std::cerr << "** " << error_string << "  Object = " << object << ", Slot = ";
  Am_Print_Key(std::cerr, key);
  std::cerr << "." << std::endl;
  Am_Error(object, key);
}